

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

Exception *
capnp::_::anon_unknown_18::toException(Exception *__return_storage_ptr__,Reader *exception)

{
  CapTableReader *pCVar1;
  PointerType PVar2;
  int iVar3;
  char *pcVar4;
  Exception *pEVar5;
  undefined4 extraout_var;
  uchar *__dest;
  Exception *extraout_RAX;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ElementCount index;
  Type type;
  SegmentReader *pSVar6;
  uchar *puVar7;
  size_t sVar8;
  size_t __n;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Reader RVar12;
  Reader RVar13;
  String reason;
  String result_1;
  Array<unsigned_char> result_2;
  String local_108;
  ElementCount local_ec;
  StructReader local_e8;
  Array<unsigned_char> local_b8;
  WirePointer local_a0;
  PointerReader local_98;
  ListReader local_78;
  String local_48;
  
  bVar9 = (exception->_reader).pointerCount == 0;
  local_78.ptr = (byte *)(exception->_reader).pointers;
  if (bVar9) {
    local_78.ptr = (byte *)(WirePointer *)0x0;
  }
  local_78.elementCount = 0x7fffffff;
  if (!bVar9) {
    local_78.elementCount = (exception->_reader).nestingLimit;
  }
  local_78.segment = (SegmentReader *)0x0;
  local_78.capTable = (CapTableReader *)0x0;
  if (!bVar9) {
    local_78.segment = (exception->_reader).segment;
    local_78.capTable = (exception->_reader).capTable;
  }
  RVar12 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_78,(void *)0x0,0);
  pcVar4 = RVar12.super_StringPtr.content.ptr;
  if ((RVar12.super_StringPtr.content.size_ - 1 < 0x12) ||
     (auVar10[0] = -(*pcVar4 == 'r'), auVar10[1] = -(pcVar4[1] == 'e'),
     auVar10[2] = -(pcVar4[2] == 'm'), auVar10[3] = -(pcVar4[3] == 'o'),
     auVar10[4] = -(pcVar4[4] == 't'), auVar10[5] = -(pcVar4[5] == 'e'),
     auVar10[6] = -(pcVar4[6] == ' '), auVar10[7] = -(pcVar4[7] == 'e'),
     auVar10[8] = -(pcVar4[8] == 'x'), auVar10[9] = -(pcVar4[9] == 'c'),
     auVar10[10] = -(pcVar4[10] == 'e'), auVar10[0xb] = -(pcVar4[0xb] == 'p'),
     auVar10[0xc] = -(pcVar4[0xc] == 't'), auVar10[0xd] = -(pcVar4[0xd] == 'i'),
     auVar10[0xe] = -(pcVar4[0xe] == 'o'), auVar10[0xf] = -(pcVar4[0xf] == 'n'),
     auVar11[0] = -((char)*(undefined2 *)(pcVar4 + 0x10) == ':'),
     auVar11[1] = -((char)((ushort)*(undefined2 *)(pcVar4 + 0x10) >> 8) == ' '), auVar11[2] = 0xff,
     auVar11[3] = 0xff, auVar11[4] = 0xff, auVar11[5] = 0xff, auVar11[6] = 0xff, auVar11[7] = 0xff,
     auVar11[8] = 0xff, auVar11[9] = 0xff, auVar11[10] = 0xff, auVar11[0xb] = 0xff,
     auVar11[0xc] = 0xff, auVar11[0xd] = 0xff, auVar11[0xe] = 0xff, auVar11[0xf] = 0xff,
     auVar11 = auVar11 & auVar10,
     (ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
             (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) != 0xffff)) {
    bVar9 = (exception->_reader).pointerCount == 0;
    local_78.ptr = (byte *)(exception->_reader).pointers;
    if (bVar9) {
      local_78.ptr = (byte *)(WirePointer *)0x0;
    }
    local_78.elementCount = 0x7fffffff;
    if (!bVar9) {
      local_78.elementCount = (exception->_reader).nestingLimit;
    }
    local_78.segment = (SegmentReader *)0x0;
    local_78.capTable = (CapTableReader *)0x0;
    if (!bVar9) {
      local_78.segment = (exception->_reader).segment;
      local_78.capTable = (exception->_reader).capTable;
    }
    RVar12 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_78,(void *)0x0,0);
    local_e8.segment = RVar12.super_StringPtr.content.ptr;
    local_78.segment = (SegmentReader *)0x55ae65;
    local_78.capTable = (CapTableReader *)0x12;
    local_e8.capTable = (CapTableReader *)(RVar12.super_StringPtr.content.size_ - 1);
    kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              (&local_108,(_ *)&local_78,(ArrayPtr<const_char> *)&local_e8,
               (ArrayPtr<const_char> *)&local_e8);
  }
  else {
    bVar9 = (exception->_reader).pointerCount == 0;
    local_78.ptr = (byte *)(exception->_reader).pointers;
    if (bVar9) {
      local_78.ptr = (byte *)(WirePointer *)0x0;
    }
    local_78.elementCount = 0x7fffffff;
    if (!bVar9) {
      local_78.elementCount = (exception->_reader).nestingLimit;
    }
    local_78.segment = (SegmentReader *)0x0;
    local_78.capTable = (CapTableReader *)0x0;
    if (!bVar9) {
      local_78.segment = (exception->_reader).segment;
      local_78.capTable = (exception->_reader).capTable;
    }
    RVar12 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_78,(void *)0x0,0);
    kj::heapString(&local_108,RVar12.super_StringPtr.content.size_ - 1);
    __n = RVar12.super_StringPtr.content.size_ - 1;
    if (__n != 0) {
      pcVar4 = (char *)local_108.content.size_;
      if ((char *)local_108.content.size_ != (char *)0x0) {
        pcVar4 = local_108.content.ptr;
      }
      memcpy(pcVar4,RVar12.super_StringPtr.content.ptr,__n);
    }
  }
  type = FAILED;
  if (0x2f < (exception->_reader).dataSize) {
    type = (Type)*(ushort *)((long)(exception->_reader).data + 4);
  }
  local_48.content.ptr = local_108.content.ptr;
  local_48.content.size_ = local_108.content.size_;
  local_48.content.disposer = local_108.content.disposer;
  local_108.content.ptr = (char *)0x0;
  local_108.content.size_ = 0;
  kj::Exception::Exception(__return_storage_ptr__,type,"(remote)",0,&local_48);
  sVar8 = local_48.content.size_;
  pcVar4 = local_48.content.ptr;
  if (local_48.content.ptr != (char *)0x0) {
    local_48.content.ptr = (char *)0x0;
    local_48.content.size_ = 0;
    (**(local_48.content.disposer)->_vptr_ArrayDisposer)
              (local_48.content.disposer,pcVar4,1,sVar8,sVar8,0);
  }
  if ((exception->_reader).pointerCount < 2) {
    local_78.segment = (SegmentReader *)0x0;
    local_78.capTable = (CapTableReader *)0x0;
    local_78.ptr = (byte *)0x0;
    local_78.elementCount = 0x7fffffff;
  }
  else {
    local_78.ptr = (byte *)((exception->_reader).pointers + 1);
    local_78.elementCount = (exception->_reader).nestingLimit;
    local_78.segment = (exception->_reader).segment;
    local_78.capTable = (exception->_reader).capTable;
  }
  PVar2 = PointerReader::getPointerType((PointerReader *)&local_78);
  if (PVar2 != NULL_) {
    bVar9 = (exception->_reader).pointerCount < 2;
    local_78.ptr = (byte *)((exception->_reader).pointers + 1);
    if (bVar9) {
      local_78.ptr = (byte *)(WirePointer *)0x0;
    }
    local_78.elementCount = (exception->_reader).nestingLimit;
    if (bVar9) {
      local_78.segment = (SegmentReader *)0x0;
      local_78.capTable = (CapTableReader *)0x0;
      local_78.elementCount = 0x7fffffff;
    }
    else {
      local_78.segment = (exception->_reader).segment;
      local_78.capTable = (exception->_reader).capTable;
    }
    RVar12 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_78,(void *)0x0,0);
    sVar8 = RVar12.super_StringPtr.content.size_ - 1;
    kj::heapString((String *)&local_e8,sVar8);
    if (sVar8 != 0) {
      pSVar6 = (SegmentReader *)local_e8.capTable;
      if ((SegmentReader *)local_e8.capTable != (SegmentReader *)0x0) {
        pSVar6 = local_e8.segment;
      }
      memcpy(pSVar6,RVar12.super_StringPtr.content.ptr,sVar8);
    }
    kj::Exception::setRemoteTrace(__return_storage_ptr__,(String *)&local_e8);
    pCVar1 = local_e8.capTable;
    pSVar6 = local_e8.segment;
    if (local_e8.segment != (SegmentReader *)0x0) {
      local_e8.segment = (SegmentReader *)0x0;
      local_e8.capTable = (CapTableReader *)0x0;
      (*(code *)**local_e8.data)(local_e8.data,pSVar6,1,pCVar1,pCVar1,0);
    }
  }
  bVar9 = (exception->_reader).pointerCount < 3;
  local_e8.data = (exception->_reader).pointers + 2;
  if (bVar9) {
    local_e8.data = (WirePointer *)0x0;
  }
  local_e8.pointers._0_4_ = (exception->_reader).nestingLimit;
  if (bVar9) {
    local_e8.segment = (SegmentReader *)0x0;
    local_e8.capTable = (CapTableReader *)0x0;
    local_e8.pointers._0_4_ = 0x7fffffff;
  }
  else {
    local_e8.segment = (exception->_reader).segment;
    local_e8.capTable = (exception->_reader).capTable;
  }
  PointerReader::getList(&local_78,(PointerReader *)&local_e8,INLINE_COMPOSITE,(word *)0x0);
  pEVar5 = (Exception *)(ulong)local_78.elementCount;
  local_ec = local_78.elementCount;
  if (local_78.elementCount != 0) {
    index = 0;
    do {
      ListReader::getStructElement(&local_e8,&local_78,index);
      if (local_e8.pointerCount == 0) {
        local_98.segment = (SegmentReader *)0x0;
        local_98.capTable = (CapTableReader *)0x0;
        local_98.pointer = (WirePointer *)0x0;
        local_98.nestingLimit = 0x7fffffff;
      }
      else {
        local_98.pointer = (WirePointer *)CONCAT44(local_e8.pointers._4_4_,(int)local_e8.pointers);
        local_98.segment = local_e8.segment;
        local_98.capTable = local_e8.capTable;
        local_98.nestingLimit = local_e8.nestingLimit;
      }
      PVar2 = PointerReader::getPointerType(&local_98);
      pEVar5 = (Exception *)CONCAT44(extraout_var,PVar2);
      if (PVar2 != NULL_) {
        if (local_e8.dataSize < 0x40) {
          local_a0.offsetAndKind.value = 0;
          local_a0.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        }
        else {
          local_a0 = *local_e8.data;
        }
        local_98.pointer = (WirePointer *)CONCAT44(local_e8.pointers._4_4_,(int)local_e8.pointers);
        local_98.nestingLimit = local_e8.nestingLimit;
        if (local_e8.pointerCount == 0) {
          local_98.pointer = (WirePointer *)0x0;
          local_98.nestingLimit = 0x7fffffff;
        }
        local_98.segment = (SegmentReader *)0x0;
        local_98.capTable = (CapTableReader *)0x0;
        if (local_e8.pointerCount != 0) {
          local_98.segment = local_e8.segment;
          local_98.capTable = local_e8.capTable;
        }
        RVar13 = PointerReader::getBlob<capnp::Data>(&local_98,(void *)0x0,0);
        sVar8 = RVar13.super_ArrayPtr<const_unsigned_char>.size_;
        __dest = (uchar *)kj::_::HeapArrayDisposer::allocateImpl
                                    (1,0,sVar8,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0
                                    );
        puVar7 = __dest;
        if (sVar8 != 0) {
          puVar7 = __dest + sVar8;
          memcpy(__dest,RVar13.super_ArrayPtr<const_unsigned_char>.ptr,sVar8);
        }
        local_b8.size_ = (long)puVar7 - (long)__dest;
        local_b8.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
        local_b8.ptr = __dest;
        kj::Exception::setDetail(__return_storage_ptr__,(DetailTypeId)local_a0,&local_b8);
        sVar8 = local_b8.size_;
        puVar7 = local_b8.ptr;
        pEVar5 = extraout_RAX;
        if (local_b8.ptr != (uchar *)0x0) {
          local_b8.ptr = (uchar *)0x0;
          local_b8.size_ = 0;
          iVar3 = (**(local_b8.disposer)->_vptr_ArrayDisposer)
                            (local_b8.disposer,puVar7,1,sVar8,sVar8,0);
          pEVar5 = (Exception *)CONCAT44(extraout_var_00,iVar3);
        }
      }
      index = index + 1;
    } while (local_ec != index);
  }
  sVar8 = local_108.content.size_;
  pcVar4 = local_108.content.ptr;
  if (local_108.content.ptr != (char *)0x0) {
    local_108.content.ptr = (char *)0x0;
    local_108.content.size_ = 0;
    iVar3 = (**(local_108.content.disposer)->_vptr_ArrayDisposer)
                      (local_108.content.disposer,pcVar4,1,sVar8,sVar8,0);
    pEVar5 = (Exception *)CONCAT44(extraout_var_01,iVar3);
  }
  return pEVar5;
}

Assistant:

kj::Exception toException(const rpc::Exception::Reader& exception) {
  auto reason = [&]() {
    if (exception.getReason().startsWith("remote exception: ")) {
      return kj::str(exception.getReason());
    } else {
      return kj::str("remote exception: ", exception.getReason());
    }
  }();

  kj::Exception result(static_cast<kj::Exception::Type>(exception.getType()),
      "(remote)", 0, kj::mv(reason));
  if (exception.hasTrace()) {
    result.setRemoteTrace(kj::str(exception.getTrace()));
  }
  for (auto detail : exception.getDetails()) {
    if (detail.hasData()) {
      result.setDetail(detail.getDetailId(), kj::heapArray(detail.getData()));
    }
  }
  return result;
}